

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O0

void Sfm_LibPreprocess(Mio_Library_t *pLib,Vec_Int_t *vGateSizes,Vec_Wrd_t *vGateFuncs,
                      Vec_Wec_t *vGateCnfs,Vec_Ptr_t *vGateHands)

{
  int iVar1;
  word Entry;
  Mio_Gate_t *pMStack_38;
  int nGates;
  Mio_Gate_t *pGate;
  Vec_Ptr_t *vGateHands_local;
  Vec_Wec_t *vGateCnfs_local;
  Vec_Wrd_t *vGateFuncs_local;
  Vec_Int_t *vGateSizes_local;
  Mio_Library_t *pLib_local;
  
  iVar1 = Mio_LibraryReadGateNum(pLib);
  Vec_IntGrow(vGateSizes,iVar1);
  Vec_WrdGrow(vGateFuncs,iVar1);
  Vec_WecInit(vGateCnfs,iVar1);
  Vec_PtrGrow(vGateHands,iVar1);
  for (pMStack_38 = Mio_LibraryReadGates(pLib); pMStack_38 != (Mio_Gate_t *)0x0;
      pMStack_38 = Mio_GateReadNext(pMStack_38)) {
    iVar1 = Mio_GateReadPinNum(pMStack_38);
    Vec_IntPush(vGateSizes,iVar1);
    Entry = Mio_GateReadTruth(pMStack_38);
    Vec_WrdPush(vGateFuncs,Entry);
    iVar1 = Vec_PtrSize(vGateHands);
    Mio_GateSetValue(pMStack_38,iVar1);
    Vec_PtrPush(vGateHands,pMStack_38);
  }
  Sfm_DecCreateCnf(vGateSizes,vGateFuncs,vGateCnfs);
  return;
}

Assistant:

void Sfm_LibPreprocess( Mio_Library_t * pLib, Vec_Int_t * vGateSizes, Vec_Wrd_t * vGateFuncs, Vec_Wec_t * vGateCnfs, Vec_Ptr_t * vGateHands )
{
    Mio_Gate_t * pGate;
    int nGates = Mio_LibraryReadGateNum(pLib);
    Vec_IntGrow( vGateSizes, nGates );
    Vec_WrdGrow( vGateFuncs, nGates );
    Vec_WecInit( vGateCnfs,  nGates );
    Vec_PtrGrow( vGateHands, nGates );
    Mio_LibraryForEachGate( pLib, pGate )
    {
        Vec_IntPush( vGateSizes, Mio_GateReadPinNum(pGate) );
        Vec_WrdPush( vGateFuncs, Mio_GateReadTruth(pGate) );
        Mio_GateSetValue( pGate, Vec_PtrSize(vGateHands) );
        Vec_PtrPush( vGateHands, pGate );
    }
    Sfm_DecCreateCnf( vGateSizes, vGateFuncs, vGateCnfs );
}